

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::basic_substring<char>::last_not_of(basic_substring<char> *this,ro_substr chars,size_t start)

{
  char *pcVar1;
  code *pcVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  
  if (start <= this->len || start == 0xffffffffffffffff) {
    uVar3 = this->len;
    if (start != 0xffffffffffffffff) {
      uVar3 = start;
    }
    do {
      bVar5 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar5) {
        return uVar3;
      }
      sVar4 = 0;
      do {
        if (chars.len == sVar4) {
          return uVar3;
        }
        pcVar1 = chars.str + sVar4;
        sVar4 = sVar4 + 1;
      } while (this->str[uVar3] != *pcVar1);
    } while( true );
  }
  if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
    pcVar2 = (code *)swi(3);
    sVar4 = (*pcVar2)();
    return sVar4;
  }
  handle_error(0x1e5106,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x176c,"start == npos || (start >= 0 && start <= len)");
}

Assistant:

size_t last_not_of(ro_substr chars, size_t start=npos) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        if(start == npos)
            start = len;
        for(size_t i = start-1; i != size_t(-1); --i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }